

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<18,_6,_6>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  Type in1;
  Type in0;
  MatrixCaseUtils local_5c [12];
  VecAccess<float,_4,_3> local_50;
  Matrix<float,_3,_2> local_38;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    getInputValue<2,6>(&in0,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
  }
  else {
    tcu::Matrix<float,_3,_2>::Matrix(&in0,(float *)s_constInMat2x3);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    getInputValue<2,6>(&in1,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)&DAT_00000001,in_ECX);
  }
  else {
    tcu::Matrix<float,_3,_2>::Matrix(&in1,(float *)(s_constInMat2x3 + 0x18));
  }
  tcu::operator/(&local_38,&in0,&in1);
  reduceToVec3(local_5c,&local_38);
  local_50.m_vector = &evalCtx->color;
  local_50.m_index[0] = 0;
  local_50.m_index[1] = 1;
  local_50.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_50,(Vector<float,_3> *)local_5c);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 / in1);
	}